

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hdr_check_sanity(bcf_hdr_t *hdr)

{
  int iVar1;
  int id_1;
  int id;
  bcf_hdr_t *hdr_local;
  
  if ((((bcf_hdr_check_sanity::PL_warned == 0) && (iVar1 = bcf_hdr_id2int(hdr,0,"PL"), -1 < iVar1))
      && (((hdr->id[0][iVar1].val)->info[2] & 0xf) != 0xf)) &&
     (((hdr->id[0][iVar1].val)->info[2] >> 8 & 0xf) != 3)) {
    fprintf(_stderr,"[W::%s] PL should be declared as Number=G\n","bcf_hdr_check_sanity");
    bcf_hdr_check_sanity::PL_warned = 1;
  }
  if (((bcf_hdr_check_sanity::GL_warned == 0) && (iVar1 = bcf_hdr_id2int(hdr,2,"GL"), -1 < iVar1))
     && ((((hdr->id[0][iVar1].val)->info[2] & 0xf) != 0xf &&
         (((hdr->id[0][iVar1].val)->info[2] >> 8 & 0xf) != 3)))) {
    fprintf(_stderr,"[W::%s] GL should be declared as Number=G\n","bcf_hdr_check_sanity");
    bcf_hdr_check_sanity::PL_warned = 1;
  }
  return;
}

Assistant:

void bcf_hdr_check_sanity(bcf_hdr_t *hdr)
{
    static int PL_warned = 0, GL_warned = 0;

    if ( !PL_warned )
    {
        int id = bcf_hdr_id2int(hdr, BCF_DT_ID, "PL");
        if ( bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,id) && bcf_hdr_id2length(hdr,BCF_HL_FMT,id)!=BCF_VL_G )
        {
            fprintf(stderr,"[W::%s] PL should be declared as Number=G\n", __func__);
            PL_warned = 1;
        }
    }
    if ( !GL_warned )
    {
        int id = bcf_hdr_id2int(hdr, BCF_HL_FMT, "GL");
        if ( bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,id) && bcf_hdr_id2length(hdr,BCF_HL_FMT,id)!=BCF_VL_G )
        {
            fprintf(stderr,"[W::%s] GL should be declared as Number=G\n", __func__);
            PL_warned = 1;
        }
    }
}